

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

adt_bytearray_t * adt_bytearray_new(uint32_t u32GrowSize)

{
  adt_bytearray_t *self_00;
  adt_bytearray_t *self;
  uint32_t u32GrowSize_local;
  
  self_00 = (adt_bytearray_t *)malloc(0x18);
  if (self_00 != (adt_bytearray_t *)0x0) {
    adt_bytearray_create(self_00,u32GrowSize);
  }
  return self_00;
}

Assistant:

adt_bytearray_t *adt_bytearray_new(uint32_t u32GrowSize)
{
   adt_bytearray_t *self = (adt_bytearray_t*) malloc(sizeof(adt_bytearray_t));
   if(self != 0){
      adt_bytearray_create(self,u32GrowSize);
   }
   return self;
}